

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::InitialPass
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  int iVar2;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == __rhs) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"must be called with at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
LAB_003f129a:
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = HandleRegexCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = HandleReplaceCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
      (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
     (((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
       (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
      (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)))) {
    bVar1 = HandleHashCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleCompareCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleAsciiCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleConfigureCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleLengthCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleConcatCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleSubstringCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleStripCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleRandomCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleFindCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleTimestampCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleMakeCIdentifierCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleGenexStripCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleUuidCommand(this,args);
        return bVar1;
      }
      std::operator+(&local_38,"does not recognize sub-command ",__rhs);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return false;
      }
      goto LAB_003f129a;
    }
    bVar1 = true;
  }
  bVar1 = HandleToUpperLowerCommand(this,args,bVar1);
  return bVar1;
}

Assistant:

bool cmStringCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("must be called with at least one argument.");
    return false;
    }

  const std::string &subCommand = args[0];
  if(subCommand == "REGEX")
    {
    return this->HandleRegexCommand(args);
    }
  else if(subCommand == "REPLACE")
    {
    return this->HandleReplaceCommand(args);
    }
  else if ( subCommand == "MD5" ||
            subCommand == "SHA1" ||
            subCommand == "SHA224" ||
            subCommand == "SHA256" ||
            subCommand == "SHA384" ||
            subCommand == "SHA512" )
    {
    return this->HandleHashCommand(args);
    }
  else if(subCommand == "TOLOWER")
    {
    return this->HandleToUpperLowerCommand(args, false);
    }
  else if(subCommand == "TOUPPER")
    {
    return this->HandleToUpperLowerCommand(args, true);
    }
  else if(subCommand == "COMPARE")
    {
    return this->HandleCompareCommand(args);
    }
  else if(subCommand == "ASCII")
    {
    return this->HandleAsciiCommand(args);
    }
  else if(subCommand == "CONFIGURE")
    {
    return this->HandleConfigureCommand(args);
    }
  else if(subCommand == "LENGTH")
    {
    return this->HandleLengthCommand(args);
    }
  else if(subCommand == "CONCAT")
    {
    return this->HandleConcatCommand(args);
    }
  else if(subCommand == "SUBSTRING")
    {
    return this->HandleSubstringCommand(args);
    }
  else if(subCommand == "STRIP")
    {
    return this->HandleStripCommand(args);
    }
  else if(subCommand == "RANDOM")
    {
    return this->HandleRandomCommand(args);
    }
  else if(subCommand == "FIND")
    {
    return this->HandleFindCommand(args);
    }
  else if(subCommand == "TIMESTAMP")
    {
    return this->HandleTimestampCommand(args);
    }
  else if(subCommand == "MAKE_C_IDENTIFIER")
    {
    return this->HandleMakeCIdentifierCommand(args);
    }
  else if(subCommand == "GENEX_STRIP")
    {
    return this->HandleGenexStripCommand(args);
    }
  else if(subCommand == "UUID")
    {
    return this->HandleUuidCommand(args);
    }

  std::string e = "does not recognize sub-command "+subCommand;
  this->SetError(e);
  return false;
}